

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O2

int Assimp::DefaultLogger::kill(__pid_t __pid,int __sig)

{
  int in_EAX;
  
  if ((undefined8 *)m_pLogger != &s_pNullLogger) {
    if (m_pLogger != (undefined *)0x0) {
      (**(code **)(*(long *)m_pLogger + 8))();
    }
    in_EAX = 0x8ccee8;
    m_pLogger = (undefined *)&s_pNullLogger;
  }
  return in_EAX;
}

Assistant:

void DefaultLogger::kill() {
    // enter the mutex here to avoid concurrency problems
#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(loggerMutex);
#endif

	if ( m_pLogger == &s_pNullLogger ) {
		return;
	}
    delete m_pLogger;
    m_pLogger = &s_pNullLogger;
}